

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

void __thiscall Buffer::produce(Buffer *this,char c)

{
  bool bVar1;
  undefined1 local_28 [8];
  unique_lock<std::mutex> lock;
  char c_local;
  Buffer *this_local;
  
  lock._15_1_ = c;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&this->mutex);
  bVar1 = isFull(this);
  if (bVar1) {
    printf("Producer %c waits (%s)\n",(ulong)(uint)(int)(char)lock._15_1_,"Buffer is full");
    std::condition_variable::wait<Buffer::produce(char)::__0>
              (&this->cond,(unique_lock<std::mutex> *)local_28,(anon_class_8_1_8991fb9c)this);
    printf("Producer %c produces element after waiting (%s)\n",(ulong)(uint)(int)(char)lock._15_1_,
           "Buffer is full");
  }
  else {
    printf("Producer %c produces element\n",(ulong)(uint)(int)(char)lock._15_1_);
  }
  this->buffer[this->position] = lock._15_1_;
  this->position = this->position + 1;
  printBuffer(this);
  std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_28);
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return;
}

Assistant:

void Buffer::produce(char c) {
    std::unique_lock<std::mutex> lock(mutex);

    if (isFull()) {
        printf("Producer %c waits (%s)\n", c, FULL_CONDITION);

        cond.wait(lock, [this]() { return !isFull(); });

        printf("Producer %c produces element after waiting (%s)\n", c, FULL_CONDITION);
    } else {
        printf("Producer %c produces element\n", c);
    }

    buffer[position] = c;
    ++position;
    printBuffer();

    lock.unlock();
    cond.notify_all();
}